

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_hugehelp.c
# Opt level: O2

void hugehelp(void)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  uchar *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  void *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  code *pcStack_60;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_68 = 0;
  uStack_50 = 0;
  uStack_90 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_38 = 0;
  local_88 = (void *)0x0;
  uStack_80 = 0;
  pcStack_60 = zalloc_func;
  local_58 = zfree_func;
  local_98 = 0x130bf;
  local_a0 = hugehelpgz + 10;
  iVar1 = inflateInit2_(&local_a0,0xfffffffffffffff1,"1.2.11",0x70);
  if (iVar1 == 0) {
    __ptr = malloc(0x10000);
    if (__ptr != (void *)0x0) {
      do {
        uStack_80 = CONCAT44(uStack_80._4_4_,0x10000);
        local_88 = __ptr;
        uVar2 = inflate(&local_a0,2);
        if (1 < uVar2) break;
        fwrite(__ptr,(ulong)(0x10000 - (int)uStack_80),1,_stdout);
      } while (uVar2 != 1);
      free(__ptr);
    }
    inflateEnd(&local_a0);
  }
  return;
}

Assistant:

void hugehelp(void)
{
  unsigned char *buf;
  int status;
  z_stream z;

  /* Make sure no gzip options are set */
  if(hugehelpgz[3] & 0xfe)
    return;

  memset(&z, 0, sizeof(z_stream));
  z.zalloc = (alloc_func)zalloc_func;
  z.zfree = (free_func)zfree_func;
  z.avail_in = (uInt)(sizeof(hugehelpgz) - HEADERLEN);
  z.next_in = (z_const Bytef *)hugehelpgz + HEADERLEN;

  if(inflateInit2(&z, -MAX_WBITS) != Z_OK)
    return;

  buf = malloc(BUF_SIZE);
  if(buf) {
    while(1) {
      z.avail_out = BUF_SIZE;
      z.next_out = buf;
      status = inflate(&z, Z_SYNC_FLUSH);
      if(status == Z_OK || status == Z_STREAM_END) {
        fwrite(buf, BUF_SIZE - z.avail_out, 1, stdout);
        if(status == Z_STREAM_END)
          break;
      }
      else
        break;    /* error */
    }
    free(buf);
  }
  inflateEnd(&z);
}